

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O1

bool __thiscall QNumberStyleAnimation::isUpdateNeeded(QNumberStyleAnimation *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  qreal qVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  iVar1 = QAbstractAnimation::currentTime();
  if (*(int *)(this + 0x10) < iVar1) {
    qVar5 = currentValue(this);
    dVar7 = *(double *)(this + 0x38);
    dVar6 = dVar7 - qVar5;
    uVar2 = -(ulong)(dVar6 < -dVar6);
    uVar3 = -(ulong)(dVar7 < -dVar7);
    uVar4 = -(ulong)(qVar5 < -qVar5);
    dVar7 = (double)(~uVar3 & (ulong)dVar7 | (ulong)-dVar7 & uVar3);
    dVar8 = (double)(~uVar4 & (ulong)qVar5 | (ulong)-qVar5 & uVar4);
    if (dVar8 <= dVar7) {
      dVar7 = dVar8;
    }
    if (dVar7 < (double)(~uVar2 & (ulong)dVar6 | (ulong)-dVar6 & uVar2) * 1000000000000.0) {
      *(qreal *)(this + 0x38) = qVar5;
      return true;
    }
  }
  return false;
}

Assistant:

bool QNumberStyleAnimation::isUpdateNeeded() const
{
    if (QStyleAnimation::isUpdateNeeded()) {
        qreal current = currentValue();
        if (!qFuzzyCompare(_prev, current))
        {
            _prev = current;
            return true;
        }
    }
    return false;
}